

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMockerBase<double_(const_char_*,_char_**,___locale_struct_*)>::
PerformDefaultAction
          (FunctionMockerBase<double_(const_char_*,_char_**,___locale_struct_*)> *this,
          ArgumentTuple *args,string *call_description)

{
  OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)> *this_00;
  pointer pcVar1;
  bool bVar2;
  Action<double_(const_char_*,_char_**,___locale_struct_*)> *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar3;
  Result RVar4;
  Result RVar5;
  string message;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  ppvVar3 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar3 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar1 = (call_description->_M_dataplus)._M_p;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_48,pcVar1,pcVar1 + call_description->_M_string_length);
      std::__cxx11::string::append((char *)local_48);
      if (DefaultValue<double>::value_ == (Result *)0x0) {
        RVar5 = 0.0;
      }
      else {
        RVar5 = *DefaultValue<double>::value_;
      }
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
      return RVar5;
    }
    this_00 = (OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)> *)ppvVar3[-1];
    ppvVar3 = ppvVar3 + -1;
    bVar2 = OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)>::Matches(this_00,args);
  } while (!bVar2);
  this_01 = OnCallSpec<double_(const_char_*,_char_**,___locale_struct_*)>::GetAction(this_00);
  RVar4 = Action<double_(const_char_*,_char_**,___locale_struct_*)>::Perform(this_01,args);
  return RVar4;
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }